

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O2

int __thiscall IPAsirMiniSAT::val(IPAsirMiniSAT *this,int lit)

{
  bool bVar1;
  Lit LVar2;
  int iVar3;
  lbool res;
  undefined8 uStack_18;
  
  iVar3 = 0;
  if (this->nomodel == false) {
    uStack_18 = 0;
    LVar2 = import(this,lit);
    uStack_18 = CONCAT17((byte)LVar2.x & 1 ^
                         (this->super_SimpSolver).super_Solver.model.data[LVar2.x >> 1].value,
                         (undefined7)uStack_18);
    bVar1 = Minisat::lbool::operator==((lbool *)((long)&uStack_18 + 7),(lbool)0x0);
    iVar3 = -lit;
    if (bVar1) {
      iVar3 = lit;
    }
  }
  return iVar3;
}

Assistant:

int val(int lit)
    {
        if (nomodel) return 0;
        lbool res = modelValue(import(lit));
        return (res == l_True) ? lit : -lit;
    }